

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O1

void __thiscall
sigslot::signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local>::operator()
          (signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *this,
          FocusDirection a1)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (*(this->super__signal_base1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local>)
    .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
    _vptr_multi_threaded_local[2])();
  p_Var2 = (this->
           super__signal_base1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local>)
           .m_connected_slots.
           super__List_base<sigslot::_connection_base1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)
                   &(this->
                    super__signal_base1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local>
                    ).m_connected_slots) {
    p_Var1 = p_Var2->_M_next;
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x18))(p_Var2[1]._M_next,a1);
    p_Var2 = p_Var1;
  }
  (*(this->super__signal_base1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local>)
    .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
    _vptr_multi_threaded_local[3])(this);
  return;
}

Assistant:

void operator()(arg1_type a1)
		{
			lock_block<mt_policy> lock(this);
			const_iterator itNext, it = this->m_connected_slots.begin();
			const_iterator itEnd = this->m_connected_slots.end();

			while(it != itEnd)
			{
				itNext = it;
				++itNext;

				(*it)->emit(a1);

				it = itNext;
			}
		}